

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SegmentBase.hpp
# Opt level: O1

bool __thiscall
CppJieba::SegmentBase::cut
          (SegmentBase *this,string *str,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *res)

{
  bool bVar1;
  undefined1 uVar2;
  Unicode unico;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_58;
  string local_38;
  int iVar3;
  
  if (this->_isInited == false) {
    __assert_fail("_getInitFlag()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/SegmentBase.hpp"
                  ,0x1e,
                  "virtual bool CppJieba::SegmentBase::cut(const string &, vector<string> &) const")
    ;
  }
  local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar1 = Limonp::utf8ToUnicode((str->_M_dataplus)._M_p,(uint)str->_M_string_length,&local_58);
  if (bVar1) {
    iVar3 = (*(this->super_ISegment)._vptr_ISegment[4])
                      (this,local_58.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                       local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                       _M_impl.super__Vector_impl_data._M_finish,res);
    uVar2 = (undefined1)iVar3;
  }
  else {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"str[%s] decode failed.","")
    ;
    Limonp::Logger::LoggingF(4,"SegmentBase.hpp",0x24,&local_38,(str->_M_dataplus)._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    uVar2 = 0;
  }
  if (local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return (bool)uVar2;
}

Assistant:

virtual bool cut(const string& str, vector<string>& res)const
            {
				assert(_getInitFlag());
                Unicode unico;
#ifdef NO_FILTER
                unico.clear();
                if(!TransCode::decode(str, unico))
                {
                    LogFatal("str[%s] decode failed.", str.c_str());
                    return false;
                }
                return cut(unico.begin(), unico.end(), res);
#else
                const char * const cstr = str.c_str();
                uint size = str.size();
                uint offset = 0;
                string subs;
                int ret;
                uint len;
                while(offset < size)
                {
                    const char * const nstr = cstr + offset;
                    uint nsize = size - offset;
                    if(-1 == (ret = filterAscii(nstr, nsize, len)) || 0 == len || len > nsize)
                    {
                        LogFatal("str[%s] illegal.", cstr);
                        return false;
                    }
                    subs.assign(nstr, len);
                    if(!ret)
                    {
                        res.push_back(subs);
                    }
                    else
                    {
                        unico.clear();
                        if(!TransCode::decode(subs, unico))
                        {
                            LogFatal("str[%s] decode failed.", subs.c_str());
                            return false;
                        }
                        cut(unico.begin(), unico.end(), res);
                    }
                    offset += len;
                }
                return true;
#endif
            }